

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O2

planck_unit_result_t
planck_unit_assert_str_are_equal
          (planck_unit_test_t *state,char *expected,char *actual,int line,char *file)

{
  planck_unit_result_t pVar1;
  int iVar2;
  char *__s;
  
  state->allocated_message = '\x01';
  iVar2 = planck_unit_check_string_space("expected \\\"%s\\\", got \\\"%s\\\"",expected,actual);
  __s = (char *)malloc((long)iVar2);
  if ((iVar2 != 0) && (__s != (char *)0x0)) {
    sprintf(__s,"expected \\\"%s\\\", got \\\"%s\\\"",expected,actual);
    iVar2 = strcmp(expected,actual);
    pVar1 = planck_unit_assert_true(state,(uint)(iVar2 == 0),line,file,__s);
    return pVar1;
  }
  free(__s);
  printf("out of memory");
  fflush(_stdout);
  exit(-1);
}

Assistant:

planck_unit_result_t
planck_unit_assert_str_are_equal(
	planck_unit_test_t	*state,
	char				*expected,
	char				*actual,
	int					line,
	const char			*file
) {
	const char	*message;
	int			message_size;
	char		*buffer;

	message						= "expected \\\"%s\\\", got \\\"%s\\\"";
	state->allocated_message	= 1;
	message_size				= planck_unit_check_string_space(message, expected, actual);
	buffer						= malloc(message_size);

	if ((NULL == buffer) || !message_size) {
		free(buffer);
		PLANCK_UNIT_PRINT_STR("out of memory");
		exit(-1);
	}

	sprintf(buffer, message, expected, actual);

	return planck_unit_assert_true(state, 0 == strcmp(expected, actual), line, file, buffer);
}